

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O2

unique_ptr<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>_>
 pstore::sparse_array<int,pstore::uint128>::
 make_unique<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            first_index,
           __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           last_index,initializer_list<int> values)

{
  sparse_array<int,pstore::uint128> *this;
  long in_R8;
  
  this = (sparse_array<int,pstore::uint128> *)
         new<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                   (0x20,last_index,
                    (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                     )values._M_array);
  sparse_array<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int_const*>
            (this,last_index,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )values._M_array,(int *)values._M_len,(int *)values._M_len + in_R8);
  *first_index._M_current = (unsigned_long)this;
  return (__uniq_ptr_data<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>,_true,_true>
          )(__uniq_ptr_data<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>,_true,_true>
            )first_index._M_current;
}

Assistant:

auto sparse_array<ValueType, BitmapType>::make_unique (IteratorIdx first_index,
                                                           IteratorIdx last_index,
                                                           std::initializer_list<ValueType> values)
        -> std::unique_ptr<sparse_array> {

        return std::unique_ptr<sparse_array<ValueType, BitmapType>>{
            new (first_index, last_index) sparse_array<ValueType, BitmapType> (
                first_index, last_index, std::begin (values), std::end (values))};
    }